

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

void Gia_ManGlaCollect(Gia_Man_t *p,Vec_Int_t *vGateClasses,Vec_Int_t **pvPis,Vec_Int_t **pvPPis,
                      Vec_Int_t **pvFlops,Vec_Int_t **pvNodes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pObj;
  Vec_Int_t **ppVVar5;
  int i;
  
  if (p->vCos->nSize - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xa3,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  if (vGateClasses->nSize != p->nObjs) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xa4,
                  "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                 );
  }
  p_00 = Gia_GlaCollectAssigned(p,vGateClasses);
  if (pvPis != (Vec_Int_t **)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    *pvPis = pVVar4;
  }
  if (pvPPis != (Vec_Int_t **)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    *pvPPis = pVVar4;
  }
  if (pvFlops != (Vec_Int_t **)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    *pvFlops = pVVar4;
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    pVVar4 = Vec_IntAlloc(1000);
    *pvNodes = pVVar4;
  }
  iVar1 = p_00->nSize;
  for (i = 0; i < iVar1; i = i + 1) {
    iVar2 = Vec_IntEntry(p_00,i);
    pObj = Gia_ManObj(p,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if (((~*(uint *)pObj & 0x9fffffff) == 0) &&
       (iVar2 = Gia_ObjCioId(pObj), iVar2 < p->vCis->nSize - p->nRegs)) {
      ppVVar5 = pvPis;
      if (pvPis != (Vec_Int_t **)0x0) {
LAB_004e727b:
        pVVar4 = *ppVVar5;
        iVar2 = Gia_ObjId(p,pObj);
        Vec_IntPush(pVVar4,iVar2);
      }
    }
    else {
      iVar2 = Gia_ObjId(p,pObj);
      iVar2 = Vec_IntEntry(vGateClasses,iVar2);
      if (iVar2 == 0) {
        ppVVar5 = pvPPis;
        if (pvPPis != (Vec_Int_t **)0x0) goto LAB_004e727b;
      }
      else {
        iVar2 = Gia_ObjIsRo(p,pObj);
        if (iVar2 == 0) {
          uVar3 = (uint)*(ulong *)pObj;
          if ((~uVar3 & 0x1fffffff) == 0 || (int)uVar3 < 0) {
            if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
              __assert_fail("Gia_ObjIsConst0(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                            ,0xb6,
                            "void Gia_ManGlaCollect(Gia_Man_t *, Vec_Int_t *, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **, Vec_Int_t **)"
                           );
            }
          }
          else {
            ppVVar5 = pvNodes;
            if (pvNodes != (Vec_Int_t **)0x0) goto LAB_004e727b;
          }
        }
        else {
          ppVVar5 = pvFlops;
          if (pvFlops != (Vec_Int_t **)0x0) goto LAB_004e727b;
        }
      }
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManGlaCollect( Gia_Man_t * p, Vec_Int_t * vGateClasses, Vec_Int_t ** pvPis, Vec_Int_t ** pvPPis, Vec_Int_t ** pvFlops, Vec_Int_t ** pvNodes )
{ 
    Vec_Int_t * vAssigned;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );
    // create included objects and their fanins
    vAssigned = Gia_GlaCollectAssigned( p, vGateClasses );
    // create additional arrays
    if ( pvPis )   *pvPis   = Vec_IntAlloc( 100 );
    if ( pvPPis )  *pvPPis  = Vec_IntAlloc( 100 );
    if ( pvFlops ) *pvFlops = Vec_IntAlloc( 100 );
    if ( pvNodes ) *pvNodes = Vec_IntAlloc( 1000 );
    Gia_ManForEachObjVec( vAssigned, p, pObj, i )
    {
        if ( Gia_ObjIsPi(p, pObj) )
            { if ( pvPis )   Vec_IntPush( *pvPis, Gia_ObjId(p,pObj) );   }
        else if ( !Vec_IntEntry(vGateClasses, Gia_ObjId(p,pObj)) )
            { if ( pvPPis )  Vec_IntPush( *pvPPis, Gia_ObjId(p,pObj) );  }
        else if ( Gia_ObjIsRo(p, pObj) )
            { if ( pvFlops ) Vec_IntPush( *pvFlops, Gia_ObjId(p,pObj) ); }
        else if ( Gia_ObjIsAnd(pObj) )
            { if ( pvNodes ) Vec_IntPush( *pvNodes, Gia_ObjId(p,pObj) ); }
        else assert( Gia_ObjIsConst0(pObj) );
    }
    Vec_IntFree( vAssigned );
}